

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins_motion.c
# Opt level: O0

void fsnav_ins_motion_euler(void)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  ulong local_128;
  size_t j;
  size_t i;
  double C_2 [9];
  double local_c8;
  double dvcor [3];
  double local_a8;
  double dvrel [3];
  double e4s4;
  double e2s2;
  double Re_h;
  double Rn_h;
  double cphi;
  double sphi;
  double dt;
  double eps;
  double alt_range [2];
  double lat_range [2];
  double lon_range [2];
  char local_10 [4];
  char alt_token [4];
  char lat_token [4];
  char lon_token [4];
  
  builtin_strncpy(alt_token,"lon",4);
  builtin_strncpy(local_10,"lat",4);
  lon_range[1]._4_4_ = 0x746c61;
  lat_range[1] = -180.0;
  lon_range[0] = 180.0;
  alt_range[1] = -90.0;
  lat_range[0] = 90.0;
  eps = -20000.0;
  alt_range[0] = 50000.0;
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      (fsnav->imu->sol).v_valid = '\0';
      (fsnav->imu->sol).llh_valid = '\0';
      dVar1 = fsnav_ins_motion_parse_double
                        (alt_token,fsnav->imu->cfg,fsnav->imu->cfglength,lat_range + 1,0.0);
      (fsnav->imu->sol).llh[0] = dVar1 / (fsnav->imu_const).rad2deg;
      dVar1 = fsnav_ins_motion_parse_double
                        (local_10,fsnav->imu->cfg,fsnav->imu->cfglength,alt_range + 1,0.0);
      (fsnav->imu->sol).llh[1] = dVar1 / (fsnav->imu_const).rad2deg;
      dVar1 = fsnav_ins_motion_parse_double
                        ((char *)((long)lon_range + 0xc),fsnav->imu->cfg,fsnav->imu->cfglength,&eps,
                         0.0);
      (fsnav->imu->sol).llh[2] = dVar1;
      (fsnav->imu->sol).llh_valid = '\x01';
      for (j = 0; j < 3; j = j + 1) {
        (fsnav->imu->sol).v[j] = 0.0;
      }
      (fsnav->imu->sol).v_valid = '\x01';
      fsnav_ins_motion_euler::t0 = -1.0;
    }
    else if ((((-1 < fsnav->mode) && ((fsnav->imu->sol).v_valid != '\0')) &&
             ((fsnav->imu->sol).llh_valid != '\0')) &&
            ((((fsnav->imu->sol).L_valid != '\0' && (fsnav->imu->f_valid != '\0')) &&
             (fsnav->imu->g_valid != '\0')))) {
      if (fsnav_ins_motion_euler::t0 < 0.0) {
        fsnav_ins_motion_euler::t0 = fsnav->imu->t;
      }
      else {
        dVar1 = fsnav->imu->t - fsnav_ins_motion_euler::t0;
        fsnav_ins_motion_euler::t0 = fsnav->imu->t;
        dVar2 = sin((fsnav->imu->sol).llh[1]);
        dVar3 = cos((fsnav->imu->sol).llh[1]);
        dVar4 = (fsnav->imu_const).e2 * dVar2 * dVar2;
        dVar5 = dVar4 * dVar4;
        dVar6 = (fsnav->imu_const).a * (dVar4 / 2.0 + 1.0 + (dVar5 * 3.0) / 8.0);
        dVar4 = dVar6 * (1.0 - (fsnav->imu_const).e2) * (dVar4 * dVar5 + dVar4 + 1.0 + dVar5) +
                (fsnav->imu->sol).llh[2];
        dVar6 = (fsnav->imu->sol).llh[2] + dVar6;
        fsnav->imu->W_valid = '\0';
        (fsnav->imu->sol).llh_valid = '\0';
        (fsnav->imu->sol).v_valid = '\0';
        fsnav->imu->W[0] = -(fsnav->imu->sol).v[1] / dVar4;
        fsnav->imu->W[1] = (fsnav->imu->sol).v[0] / dVar6;
        if (0.00390625 <= dVar3) {
          fsnav->imu->W[2] = (((fsnav->imu->sol).v[0] / dVar6) * dVar2) / dVar3;
          fsnav->imu->W_valid = '\x01';
        }
        else {
          fsnav->imu->W[2] = 0.0;
          fsnav->imu->W_valid = '\0';
        }
        local_a8 = fsnav->imu->W[0];
        dvrel[0] = (fsnav->imu_const).u * 2.0 * dVar3 + fsnav->imu->W[1];
        dvrel[1] = (fsnav->imu_const).u * 2.0 * dVar2 + fsnav->imu->W[2];
        fsnav_linal_cross3x1(&local_c8,(fsnav->imu->sol).v,&local_a8);
        if (fsnav->imu->w_valid == '\0') {
          fsnav_linal_mmul1T(&local_a8,(fsnav->imu->sol).L,fsnav->imu->f,3,3,1);
        }
        else {
          for (j = 0; j < 3; j = j + 1) {
            dvrel[j - 1] = (fsnav->imu->w[j] * dVar1) / 2.0;
          }
          fsnav_linal_eul2mat((double *)&i,&local_a8);
          for (j = 0; j < 3; j = j + 1) {
            local_128 = 1;
            C_2[j - 1] = C_2[j * 3 + -1] * fsnav->imu->f[0];
            for (; local_128 < 3; local_128 = local_128 + 1) {
              C_2[j - 1] = C_2[j * 3 + local_128 + -1] * fsnav->imu->f[local_128] + C_2[j - 1];
            }
          }
          fsnav_linal_mmul1T(&local_a8,(fsnav->imu->sol).L,(double *)&i,3,3,1);
        }
        for (j = 0; j < 3; j = j + 1) {
          (fsnav->imu->sol).v[j] =
               (dvcor[j - 1] + dvrel[j - 1] + fsnav->imu->g[j]) * dVar1 + (fsnav->imu->sol).v[j];
        }
        (fsnav->imu->sol).v_valid = '\x01';
        if (0.00390625 <= dVar3) {
          (fsnav->imu->sol).llh[0] =
               ((fsnav->imu->sol).v[0] / (dVar6 * dVar3)) * dVar1 + (fsnav->imu->sol).llh[0];
          (fsnav->imu->sol).llh[1] =
               ((fsnav->imu->sol).v[1] / dVar4) * dVar1 + (fsnav->imu->sol).llh[1];
          (fsnav->imu->sol).llh[2] = (fsnav->imu->sol).v[2] * dVar1 + (fsnav->imu->sol).llh[2];
          if ((fsnav->imu->sol).llh[1] < -(fsnav->imu_const).pi / 2.0) {
            (fsnav->imu->sol).llh[1] = -(fsnav->imu_const).pi - (fsnav->imu->sol).llh[1];
            fsnav_ins_motion_flip_sol_over_pole(&fsnav->imu->sol);
          }
          if ((fsnav->imu_const).pi / 2.0 < (fsnav->imu->sol).llh[1]) {
            (fsnav->imu->sol).llh[1] = (fsnav->imu_const).pi - (fsnav->imu->sol).llh[1];
            fsnav_ins_motion_flip_sol_over_pole(&fsnav->imu->sol);
          }
          while ((fsnav->imu->sol).llh[0] < -(fsnav->imu_const).pi) {
            dVar1 = (fsnav->imu_const).pi;
            (fsnav->imu->sol).llh[0] = dVar1 + dVar1 + (fsnav->imu->sol).llh[0];
          }
          while (dVar1 = (fsnav->imu->sol).llh[0],
                (fsnav->imu_const).pi <= dVar1 && dVar1 != (fsnav->imu_const).pi) {
            dVar1 = (fsnav->imu_const).pi;
            (fsnav->imu->sol).llh[0] = (fsnav->imu->sol).llh[0] - (dVar1 + dVar1);
          }
          (fsnav->imu->sol).llh_valid = '\x01';
        }
        else {
          (fsnav->imu->sol).llh[2] = (fsnav->imu->sol).v[2] * dVar1 + (fsnav->imu->sol).llh[2];
          (fsnav->imu->sol).llh_valid = '\0';
        }
      }
    }
  }
  return;
}

Assistant:

void fsnav_ins_motion_euler(void) {

	const char 
		lon_token[] = "lon",        // starting longitude parameter name in configuration
		lat_token[] = "lat",        // starting latitude  parameter name in configuration
		alt_token[] = "alt";        // starting altitude  parameter name in configuration

	const double 
		lon_range[] = {-180, +180},	// longitude range, 0 by default
		lat_range[] = { -90,  +90},	// latitude  range, 0 by default
		alt_range[] = {-20e3,50e3},	// altitude  range, 0 by default
		eps = 1.0/0x0100;			// 2^-8, guaranteed non-zero value in IEEE754 half-precision format

	static double t0  = -1;         // previous time

	double dt;                      // time step
	double
		sphi, cphi,	                // sine and cosine of latitude
		Rn_h, Re_h,	                // south-to-north and east-to-west curvature radii, altitude-adjusted
		e2s2, e4s4,	                // e^2*sin(phi)^2, (e^2*sin(phi)^2)^2
		dvrel[3],	                // proper acceleration in navigation frame
		dvcor[3],	                // Coriolis acceleration in navigation frame
		C_2[9];                     // intermediate matrix/vector for modified Euler component
	size_t i, j;                    // common index variables


	// check if imu data has been initialized
	if (fsnav->imu == NULL)
		return;

	if (fsnav->mode == 0) {		// init

		// drop validity flags
		fsnav->imu->sol.  v_valid = 0;
		fsnav->imu->sol.llh_valid = 0;		
		// parse parameters from configuration	
		fsnav->imu->sol.llh[0] = // starting longitude
			fsnav_ins_motion_parse_double(lon_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lon_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[1] = // starting latitude
			fsnav_ins_motion_parse_double(lat_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)lat_range,0)
			/fsnav->imu_const.rad2deg; // degrees to radians
		fsnav->imu->sol.llh[2] = // starting altitude
			fsnav_ins_motion_parse_double(alt_token, fsnav->imu->cfg,fsnav->imu->cfglength, (double *)alt_range,0);
		// raise coordinates validity flag
		fsnav->imu->sol.llh_valid = 1;
		// zero velocity at start
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] = 0;
		fsnav->imu->sol.v_valid = 1;
		// reset previous time
		t0 = -1;

	}

	else if (fsnav->mode < 0) {	// termination
		// do nothing
	}

	else						// main cycle
	{
		// check for crucial data initialized
		if (   !fsnav->imu->sol.  v_valid 
			|| !fsnav->imu->sol.llh_valid 
			|| !fsnav->imu->sol.  L_valid 
			|| !fsnav->imu->f_valid 
			|| !fsnav->imu->g_valid)
			return;
		// time variables
		if (t0 < 0) { // first touch
			t0 = fsnav->imu->t;
			return;
		}
		dt = fsnav->imu->t - t0;
		t0 = fsnav->imu->t;
		// ellipsoid geometry
		sphi = sin(fsnav->imu->sol.llh[1]);
		cphi = cos(fsnav->imu->sol.llh[1]);
		e2s2 = fsnav->imu_const.e2*sphi*sphi;
		e4s4 = e2s2*e2s2;					
		Re_h = fsnav->imu_const.a*(1 + e2s2/2 + 3*e4s4/8);	                                        // Taylor expansion within 0.5 m, not altitude-adjusted
		Rn_h = Re_h*(1 - fsnav->imu_const.e2)*(1 + e2s2 + e4s4 + e2s2*e4s4) + fsnav->imu->sol.llh[2]; // Taylor expansion within 0.5 m
		Re_h += fsnav->imu->sol.llh[2];						                                        // adjust for altitude
		// drop validity flags
		fsnav->imu->W_valid       = 0;
		fsnav->imu->sol.llh_valid = 0;
		fsnav->imu->sol.  v_valid = 0;
		// angular rate of navigation frame relative to the Earth
		fsnav->imu->W[0] = -fsnav->imu->sol.v[1]/Rn_h;
		fsnav->imu->W[1] =  fsnav->imu->sol.v[0]/Re_h;	
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->W[2] = 0;    // freeze
			fsnav->imu->W_valid = 0; // drop validity
		}
		else {
			fsnav->imu->W[2] = fsnav->imu->sol.v[0]/Re_h*sphi/cphi;
			fsnav->imu->W_valid = 1;
		}
		// velocity
			// Coriolis acceleration
		dvrel[0] = fsnav->imu->W[0];
		dvrel[1] = fsnav->imu->W[1] + 2*fsnav->imu_const.u*cphi;
		dvrel[2] = fsnav->imu->W[2] + 2*fsnav->imu_const.u*sphi;
		fsnav_linal_cross3x1(dvcor, fsnav->imu->sol.v, dvrel);
			// proper acceleration
		if (fsnav->imu->w_valid) { // if able to calculate attitude mid-point using gyroscopes
			for (i = 0; i < 3; i++)
				dvrel[i] = fsnav->imu->w[i]*dt/2; // midpoint rotation Euler vector
			fsnav_linal_eul2mat(C_2, dvrel); // midpoint attitude matrix factor
			for (i = 0; i < 3; i++) // multiply C_2*f, store in the first row of C_2
				for (j = 1, C_2[i] = C_2[i*3]*fsnav->imu->f[0]; j < 3; j++)
					C_2[i] += C_2[i*3+j]*fsnav->imu->f[j];
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, C_2, 3, 3, 1); // dvrel = L^T(t+dt)*C_2(w*dt/2)*f
		}
		else // otherwise, go on with only the current attitude matrix
			fsnav_linal_mmul1T(dvrel, fsnav->imu->sol.L, fsnav->imu->f, 3, 3, 1);
			// velocity update
		for (i = 0; i < 3; i++)
			fsnav->imu->sol.v[i] += (dvcor[i] + dvrel[i] + fsnav->imu->g[i])*dt;
		fsnav->imu->sol.v_valid = 1;
		// coordinates
		if (cphi < eps) { // check for Earth pole proximity
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			fsnav->imu->sol.llh_valid = 0; // drop validity
		}
		else {
			fsnav->imu->sol.llh[0] += fsnav->imu->sol.v[0]/(Re_h*cphi)	*dt;
			fsnav->imu->sol.llh[1] += fsnav->imu->sol.v[1]/ Rn_h			*dt;
			fsnav->imu->sol.llh[2] += fsnav->imu->sol.v[2]				*dt;
			// flip latitude if crossed a pole
			if (fsnav->imu->sol.llh[1] < -fsnav->imu_const.pi/2) { // South pole
				fsnav->imu->sol.llh[1] = -fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			if (fsnav->imu->sol.llh[1] > +fsnav->imu_const.pi/2) { // North pole
				fsnav->imu->sol.llh[1] = +fsnav->imu_const.pi - fsnav->imu->sol.llh[1];
				fsnav_ins_motion_flip_sol_over_pole(&(fsnav->imu->sol));			
			}
			// adjust longitude into range
			while (fsnav->imu->sol.llh[0] < -fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] += 2*fsnav->imu_const.pi;
			while (fsnav->imu->sol.llh[0] > +fsnav->imu_const.pi)
				fsnav->imu->sol.llh[0] -= 2*fsnav->imu_const.pi;
			fsnav->imu->sol.llh_valid = 1;
		}
	}

}